

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,char_type t_char,int line,int col,string *filename)

{
  size_type sVar1;
  eval_error *this_00;
  bool local_7a;
  bool local_79;
  bool local_6e;
  File_Position local_6c [3];
  allocator<char> local_51;
  string local_50;
  bool local_2a;
  bool local_29;
  bool is_hex_char;
  string *psStack_28;
  bool is_octal_char;
  string *filename_local;
  int local_18;
  int col_local;
  int line_local;
  char_type t_char_local;
  Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_6e = '/' < t_char && t_char < '8';
  local_29 = local_6e;
  if (((t_char < '0') || (local_79 = true, '9' < t_char)) &&
     ((t_char < 'a' || (local_79 = true, 'f' < t_char)))) {
    local_7a = '@' < t_char && t_char < 'G';
    local_79 = local_7a;
  }
  local_2a = local_79;
  psStack_28 = filename;
  filename_local._4_4_ = col;
  local_18 = line;
  col_local._3_1_ = t_char;
  _line_local = this;
  if ((this->is_octal & 1U) == 0) {
    if ((this->is_hex & 1U) == 0) {
      if (this->unicode_size != 0) {
        if (local_79 != false) {
          Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&this->hex_matches,t_char);
          sVar1 = Catch::clara::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                            (&this->hex_matches);
          if (sVar1 != this->unicode_size) {
            return;
          }
          process_unicode(this);
          return;
        }
        process_unicode(this);
      }
    }
    else {
      if (local_79 != false) {
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&this->hex_matches,t_char);
        sVar1 = Catch::clara::std::__cxx11::
                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                          (&this->hex_matches);
        if (sVar1 != 2) {
          return;
        }
        process_hex(this);
        return;
      }
      process_hex(this);
    }
  }
  else {
    if ('/' < t_char && t_char < '8') {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back(&this->octal_matches,t_char);
      sVar1 = Catch::clara::std::__cxx11::
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&this->octal_matches);
      if (sVar1 != 3) {
        return;
      }
      process_octal(this);
      return;
    }
    process_octal(this);
  }
  if (col_local._3_1_ == '\\') {
    if ((this->is_escaped & 1U) == 0) {
      this->is_escaped = true;
    }
    else {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back(this->match,'\\');
      this->is_escaped = false;
    }
  }
  else if ((this->is_escaped & 1U) == 0) {
    if (((this->interpolation_allowed & 1U) == 0) || (col_local._3_1_ != '$')) {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back(this->match,col_local._3_1_);
    }
    else {
      this->saw_interpolation_marker = true;
    }
  }
  else if ((local_29 & 1U) == 0) {
    if (col_local._3_1_ == 'x') {
      this->is_hex = true;
    }
    else if (col_local._3_1_ == 'u') {
      this->unicode_size = 4;
    }
    else if (col_local._3_1_ == 'U') {
      this->unicode_size = 8;
    }
    else {
      switch(col_local._3_1_) {
      case '\"':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\"');
        break;
      default:
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Unknown escaped sequence in string",&local_51);
        File_Position::File_Position(local_6c,local_18,filename_local._4_4_);
        exception::eval_error::eval_error(this_00,&local_50,local_6c,psStack_28);
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      case '$':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'$');
        break;
      case '\'':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\'');
        break;
      case '?':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'?');
        break;
      case 'a':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\a');
        break;
      case 'b':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\b');
        break;
      case 'f':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\f');
        break;
      case 'n':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\n');
        break;
      case 'r':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\r');
        break;
      case 't':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\t');
        break;
      case 'v':
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this->match,'\v');
      }
      this->is_escaped = false;
    }
  }
  else {
    this->is_octal = true;
    Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    push_back(&this->octal_matches,col_local._3_1_);
  }
  return;
}

Assistant:

void parse(const char_type t_char, const int line, const int col, const std::string &filename) {
          const bool is_octal_char = t_char >= '0' && t_char <= '7';

          const bool is_hex_char = (t_char >= '0' && t_char <= '9') || (t_char >= 'a' && t_char <= 'f') || (t_char >= 'A' && t_char <= 'F');

          if (is_octal) {
            if (is_octal_char) {
              octal_matches.push_back(t_char);

              if (octal_matches.size() == 3) {
                process_octal();
              }
              return;
            } else {
              process_octal();
            }
          } else if (is_hex) {
            if (is_hex_char) {
              hex_matches.push_back(t_char);

              if (hex_matches.size() == 2 * sizeof(char_type)) {
                // This rule differs from the C/C++ standard, but ChaiScript
                // does not offer the same workaround options, and having
                // hexadecimal sequences longer than can fit into the char
                // type is undefined behavior anyway.
                process_hex();
              }
              return;
            } else {
              process_hex();
            }
          } else if (unicode_size > 0) {
            if (is_hex_char) {
              hex_matches.push_back(t_char);

              if (hex_matches.size() == unicode_size) {
                // Format is specified to be 'slash'uABCD
                // on collecting from A to D do parsing
                process_unicode();
              }
              return;
            } else {
              // Not a unicode anymore, try parsing any way
              // May be someone used 'slash'uAA only
              process_unicode();
            }
          }

          if (t_char == '\\') {
            if (is_escaped) {
              match.push_back('\\');
              is_escaped = false;
            } else {
              is_escaped = true;
            }
          } else {
            if (is_escaped) {
              if (is_octal_char) {
                is_octal = true;
                octal_matches.push_back(t_char);
              } else if (t_char == 'x') {
                is_hex = true;
              } else if (t_char == 'u') {
                unicode_size = 4;
              } else if (t_char == 'U') {
                unicode_size = 8;
              } else {
                switch (t_char) {
                  case ('\''):
                    match.push_back('\'');
                    break;
                  case ('\"'):
                    match.push_back('\"');
                    break;
                  case ('?'):
                    match.push_back('?');
                    break;
                  case ('a'):
                    match.push_back('\a');
                    break;
                  case ('b'):
                    match.push_back('\b');
                    break;
                  case ('f'):
                    match.push_back('\f');
                    break;
                  case ('n'):
                    match.push_back('\n');
                    break;
                  case ('r'):
                    match.push_back('\r');
                    break;
                  case ('t'):
                    match.push_back('\t');
                    break;
                  case ('v'):
                    match.push_back('\v');
                    break;
                  case ('$'):
                    match.push_back('$');
                    break;
                  default:
                    throw exception::eval_error("Unknown escaped sequence in string", File_Position(line, col), filename);
                }
                is_escaped = false;
              }
            } else if (interpolation_allowed && t_char == '$') {
              saw_interpolation_marker = true;
            } else {
              match.push_back(t_char);
            }
          }
        }